

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O3

QString * __thiscall QFontListView::text(QString *__return_storage_ptr__,QFontListView *this,int i)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::model((QAbstractItemView *)this);
  QStringListModel::stringList();
  pDVar1 = QStack_38.ptr[i].d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = QStack_38.ptr[i].d.ptr;
  (__return_storage_ptr__->d).size = QStack_38.ptr[i].d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString text(int i) const {
        return model()->stringList().at(i);
    }